

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall tinyusdz::Attribute::get_value<bool>(Attribute *this,bool *v)

{
  value_type_conflict *pvVar1;
  optional<bool> ret;
  undefined1 local_1c [4];
  
  if (v == (bool *)0x0) {
    local_1c[0] = '\0';
  }
  else {
    primvar::PrimVar::get_value<bool>((PrimVar *)local_1c);
    local_1c[2] = local_1c[0];
    if (local_1c[0] != '\0') {
      local_1c[3] = local_1c[1];
      pvVar1 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)(local_1c + 2));
      *v = *pvVar1;
    }
  }
  return (bool)local_1c[0];
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }